

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles2::Functional::eval_selection_bvec2(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  int i;
  long lVar4;
  Vector<bool,_2> *pVVar5;
  Vector<bool,_2> res_1;
  Vector<bool,_2> res;
  undefined2 local_3a;
  Vector<float,_2> res_2;
  float local_30 [2];
  ulong local_28;
  float local_20 [2];
  ulong local_18;
  int local_8 [2];
  
  fVar1 = c->in[0].m_data[2];
  uVar3 = *(ulong *)c->in[1].m_data;
  local_18 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_20[0] = 0.0;
  local_20[1] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  lVar4 = 0;
  do {
    fVar2 = *(float *)((long)&local_18 + lVar4 * 4);
    res.m_data[lVar4] = local_20[lVar4] <= fVar2 && fVar2 != local_20[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  uVar3 = *(ulong *)(c->in[2].m_data + 1);
  local_28 = uVar3 << 0x20 | uVar3 >> 0x20;
  local_30[0] = 0.0;
  local_30[1] = 0.0;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  lVar4 = 0;
  do {
    fVar2 = *(float *)((long)&local_28 + lVar4 * 4);
    res_1.m_data[lVar4] = local_30[lVar4] <= fVar2 && fVar2 != local_30[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  pVVar5 = &res_1;
  if (0.0 < fVar1) {
    pVVar5 = &res;
  }
  local_3a = *(undefined2 *)pVVar5->m_data;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar4 = 0;
  do {
    res_2.m_data[lVar4] = (float)(int)*(char *)((long)res_2.m_data + lVar4 + -2);
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  local_8[0] = 1;
  local_8[1] = 2;
  lVar4 = 0;
  do {
    (c->color).m_data[local_8[lVar4]] = res_2.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  return;
}

Assistant:

void eval_selection_bvec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(1, 0), Vec2(0.0f, 0.0f)),					greaterThan(c.in[2].swizzle(2, 1), Vec2(0.0f, 0.0f))).asFloat(); }